

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genDumpFunction_abi_cxx11_(CppGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  QueryCompiler *pQVar3;
  char *in_RSI;
  CppGenerator *in_RDI;
  size_t agg;
  Attribute *attr;
  size_t var;
  string fields;
  View *view;
  size_t viewID;
  string *returnString;
  string *in_stack_fffffffffffff878;
  QueryCompiler *in_stack_fffffffffffff880;
  Attribute *in_stack_fffffffffffff888;
  undefined7 in_stack_fffffffffffff890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b0;
  CppGenerator *__rhs_00;
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  QueryCompiler *local_368;
  string local_360 [32];
  string local_340 [32];
  Attribute *local_320;
  reference local_318;
  ulong local_308;
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  View *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  string local_128 [32];
  string local_108 [48];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  __rhs_00 = in_RDI;
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8b0);
  std::operator+((char *)in_stack_fffffffffffff888,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff880);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
  offset_abi_cxx11_(in_RDI,(size_t)in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar1 = local_130;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a5371);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x2a5379);
    if (__rhs <= pbVar1) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a53a1);
    local_138 = QueryCompiler::getView(in_stack_fffffffffffff880,(size_t)in_stack_fffffffffffff878);
    if (local_138->_origin == local_138->_destination) {
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::bitset<100UL>::count((bitset<100UL> *)0x2a5614);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size(&local_138->_aggregates);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::__cxx11::string::operator+=((string *)in_RDI,local_158);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_2d8);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"",&local_2f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      for (local_308 = 0; local_308 < 100; local_308 = local_308 + 1) {
        std::bitset<100UL>::operator[]
                  ((bitset<100UL> *)in_stack_fffffffffffff888,(size_t)in_stack_fffffffffffff880);
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)in_stack_fffffffffffff880);
        std::bitset<100UL>::reference::~reference(&local_318);
        if ((bVar2 & 1) != 0) {
          std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2a5831);
          in_stack_fffffffffffff888 =
               TreeDecomposition::getAttribute
                         ((TreeDecomposition *)CONCAT17(bVar2,in_stack_fffffffffffff890),
                          (size_t)in_stack_fffffffffffff888);
          local_320 = in_stack_fffffffffffff888;
          std::operator+(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
          std::__cxx11::string::operator+=(local_2f8,local_340);
          std::__cxx11::string::~string(local_340);
          std::__cxx11::string::~string(local_360);
        }
      }
      local_368 = (QueryCompiler *)0x0;
      while (in_stack_fffffffffffff880 = local_368,
            pQVar3 = (QueryCompiler *)
                     std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                               (&local_138->_aggregates), in_stack_fffffffffffff880 < pQVar3) {
        std::__cxx11::to_string((unsigned_long)in_RDI);
        std::operator+((char *)in_stack_fffffffffffff888,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff880);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
        std::__cxx11::string::operator+=(local_2f8,local_388);
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string(local_3a8);
        std::__cxx11::string::~string(local_3c8);
        local_368 = (QueryCompiler *)
                    ((long)&(local_368->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 1);
      }
      in_stack_fffffffffffff878 = local_2f8;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      offset_abi_cxx11_(in_RDI,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
      std::__cxx11::string::operator+=((string *)in_RDI,local_3e8);
      std::__cxx11::string::~string(local_3e8);
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string(local_6c8);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string(local_6a8);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::string::~string(local_4a8);
      std::__cxx11::string::~string(local_4c8);
      std::__cxx11::string::~string(local_688);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::~string(local_528);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string(local_668);
      std::__cxx11::string::~string(local_588);
      std::__cxx11::string::~string(local_5a8);
      std::__cxx11::string::~string(local_648);
      std::__cxx11::string::~string(local_5c8);
      std::__cxx11::string::~string(local_5e8);
      std::__cxx11::string::~string(local_608);
      std::__cxx11::string::~string(local_628);
      std::__cxx11::string::~string(local_2f8);
    }
    local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_130->field_0x1;
  }
  offset_abi_cxx11_(in_RDI,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
  std::__cxx11::string::operator+=((string *)in_RDI,local_6e8);
  std::__cxx11::string::~string(local_6e8);
  std::__cxx11::string::~string(local_708);
  std::__cxx11::string::~string(local_728);
  return (string *)__rhs_00;
}

Assistant:

std::string CppGenerator::genDumpFunction()
{
    std::string returnString = "#ifdef DUMP_OUTPUT\n"+
        offset(1)+"void dumpOutputViews()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs;\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        returnString += offset(2)+"ofs.open(\"output/"+
            viewName[viewID]+".tbl\");\n"+
            offset(2)+"ofs << \""+std::to_string(view->_fVars.count())+" "+
            std::to_string(view->_aggregates.size())+"\\n\";\n";
            
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n"+
            offset(2)+"ofs.close();\n";
    }

    returnString += offset(1)+"}\n"+"#endif\n";
    return returnString;
}